

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

int OpenSSLWrapper::SslServerContext::ALPN_CB
              (SSL *param_1,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  bool bVar1;
  __type _Var2;
  reference __rhs;
  ulong uVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  byte *pbVar7;
  allocator local_99;
  undefined1 local_98 [8];
  string strProtokoll;
  uint8_t nLen;
  byte *pbStack_70;
  uint i;
  uint8_t *inTmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *strProt;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  SslServerContext *pSslCtx;
  void *arg_local;
  uint inlen_local;
  uchar *in_local;
  uchar *outlen_local;
  uchar **out_local;
  SSL *param_0_local;
  
  if (((arg != (void *)0x0) && (in != (uchar *)0x0)) && (out != (uchar **)0x0)) {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)arg + 0x48));
    strProt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)arg + 0x48));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&strProt), bVar1) {
      __rhs = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
      strProtokoll.field_2._12_4_ = 0;
      pbStack_70 = in;
      while ((uint)strProtokoll.field_2._12_4_ < inlen) {
        pbVar7 = pbStack_70 + 1;
        strProtokoll.field_2._M_local_buf[0xb] = *pbStack_70;
        uVar3 = (ulong)(byte)strProtokoll.field_2._M_local_buf[0xb];
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_98,(char *)pbVar7,uVar3,&local_99);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        iVar4 = std::begin<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
        iVar5 = std::end<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
        iVar6 = std::begin<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
        std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,OpenSSLWrapper::SslServerContext::ALPN_CB(ssl_st*,unsigned_char_const**,unsigned_char*,unsigned_char_const*,unsigned_int,void*)::__0>
                  (iVar4._M_current,iVar5._M_current,iVar6._M_current);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,__rhs);
        if (_Var2) {
          *out = pbVar7;
          *outlen = strProtokoll.field_2._M_local_buf[0xb];
          param_0_local._4_4_ = 0;
          pbStack_70 = pbVar7;
        }
        else {
          strProtokoll.field_2._12_4_ =
               (byte)strProtokoll.field_2._M_local_buf[0xb] + 1 + strProtokoll.field_2._12_4_;
          pbStack_70 = pbVar7 + (int)(uint)(byte)strProtokoll.field_2._M_local_buf[0xb];
        }
        std::__cxx11::string::~string((string *)local_98);
        if (_Var2) {
          return param_0_local._4_4_;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return 1;
}

Assistant:

int SslServerContext::ALPN_CB(SSL* /*ssl*/, const unsigned char **out, unsigned char *outlen, const unsigned char *in, unsigned int inlen, void *arg)
    {
        SslServerContext* pSslCtx = static_cast<SslServerContext*>(arg);
        if (pSslCtx == nullptr || in == nullptr || out == nullptr)
            return 1;

        for (auto& strProt : pSslCtx->m_vstrAlpnProtoList)
        {
            const uint8_t* inTmp = in;
            for (unsigned int i = 0; i < inlen;)
            {
                uint8_t nLen = *inTmp++;
                string strProtokoll(reinterpret_cast<const char*>(inTmp), static_cast<size_t>(nLen));
                transform(begin(strProtokoll), end(strProtokoll), begin(strProtokoll), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

                if (strProtokoll == strProt)
                {
                    *out = inTmp, *outlen = nLen;
                    return 0;
                }
                inTmp += nLen;
                i += nLen + 1;
            }
        }

        return 1;
    }